

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_fft.hpp
# Opt level: O2

void __thiscall
re::fft::simd_fft<float,_256L>::set_twiddles(simd_fft<float,_256L> *this,int_t stage)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  simd_fft<float,_256L> *psVar4;
  
  bVar1 = (byte)stage & 0x1f;
  uVar3 = 0;
  uVar2 = (ulong)(uint)(1 << bVar1);
  if (1 << bVar1 < 1) {
    uVar2 = uVar3;
  }
  psVar4 = this;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    (this->w_twiddles)._M_elems[uVar3]._M_value = (psVar4->twiddles)._M_elems[0]._M_value;
    psVar4 = (simd_fft<float,_256L> *)
             ((long)&(psVar4->twiddles)._M_elems[0]._M_value +
             (ulong)(uint)((int)(0x80L >> ((byte)stage & 0x3f)) << 3));
  }
  return;
}

Assistant:

void set_twiddles(int_t stage) noexcept {
        auto const n = 1 << stage;
        auto const stride = remainder() >> stage;

        for (auto i = 0; i < n; ++i) {
            w_twiddles[i] = twiddles[i * stride];
        }
        /*
        for (auto i = 1; i * n < simd::width<cpx_t>; ++i) {
            for (auto j = 0; j < n; ++j) {
                w_twiddles[i * n + j] = w_twiddles[j];
            }
        }
         */
    }